

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.hpp
# Opt level: O1

void __thiscall
Indexing::AlascaIndex<Inferences::ALASCA::BinaryResolutionConf::Rhs>::handleClause
          (AlascaIndex<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,Clause *c,bool adding)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  byte bVar4;
  undefined8 unaff_RBX;
  undefined8 uVar5;
  undefined4 uVar6;
  ulong in_R8;
  undefined4 unaff_R12D;
  byte unaff_R13B;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:249:17),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:80:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  *pIVar7;
  Option<Inferences::ALASCA::BinaryResolutionConf::Rhs> local_1e0;
  Clause *local_1a8;
  uint local_1a0;
  char local_19c;
  ulong local_198;
  int iStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  char cStack_184;
  undefined7 uStack_183;
  LeafData local_178;
  Option<Inferences::ALASCA::BinaryResolutionConf::Rhs> local_148;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:249:17),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:80:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  local_110;
  Option<Inferences::ALASCA::BinaryResolutionConf::Rhs> *__return_storage_ptr__;
  
  Inferences::ALASCA::BinaryResolutionConf::Rhs::iter
            (&local_110,
             (this->_shared).super___shared_ptr<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,c);
  ::Lib::
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:249:17),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:80:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  ::tryNext(&local_1e0,&local_110);
  if (local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._isSome == true) {
    pIVar7 = &local_110;
    do {
      uVar3 = local_178.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem.init._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              .
              super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
              ._content[0x13];
      uVar2 = local_178.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._16_4_;
      uVar1 = local_178.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._12_4_;
      uVar6 = local_178.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._8_4_;
      if (local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.init
          .super_SelectedLiteral.interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._isSome == true) {
        unaff_R13B = local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem
                     ._elem._16_1_ & 3;
        pIVar7 = (IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:249:17),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:80:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
                  *)((ulong)local_1e0.
                            super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                            _elem._16_8_ >> 8 & 0xffffffff);
        unaff_RBX = CONCAT17(local_1e0.
                             super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                             _elem._32_1_,
                             CONCAT43(local_1e0.
                                      super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>
                                      ._elem._elem._28_4_,
                                      local_1e0.
                                      super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>
                                      ._elem._elem._25_3_));
        unaff_R12D = CONCAT13(local_1e0.
                              super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                              _elem._36_1_,
                              local_1e0.
                              super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                              _elem._33_3_);
      }
      local_178.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem.init._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._content[0xf] = (char)((ulong)unaff_RBX >> 0x38);
      local_178.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._9_3_ = (undefined3)unaff_RBX;
      local_178.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._12_4_ = (undefined4)((ulong)unaff_RBX >> 0x18);
      local_178.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem.init._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._content[0x13] = (char)((uint)unaff_R12D >> 0x18);
      local_178.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._17_3_ = (undefined3)unaff_R12D;
      if (adding) {
        local_178.super_SelectedLiteral.litIdx =
             local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
             init.super_SelectedLiteral.litIdx;
        local_178.super_SelectedLiteral.cl =
             local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
             init.super_SelectedLiteral.cl;
        local_178.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._isSome = local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                   _elem.init.super_SelectedLiteral.interpreted.
                   super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                   ._isSome;
        if (local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
            init.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._isSome != false) {
          local_178.super_SelectedLiteral.interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._elem._elem._21_7_ = 0;
          local_178.super_SelectedLiteral.interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._elem._elem._0_5_ = CONCAT41((int)pIVar7,unaff_R13B) & 0xffffffff03;
          local_178.super_SelectedLiteral.interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._elem._elem._5_3_ = 0;
          local_178.super_SelectedLiteral.interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._elem._elem._8_4_ =
               (uint)(uint3)local_178.super_SelectedLiteral.interpreted.
                            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                            ._elem._elem._9_3_ << 8;
          uVar6 = local_178.super_SelectedLiteral.interpreted.
                  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  ._elem._elem._8_4_;
          uVar1 = local_178.super_SelectedLiteral.interpreted.
                  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  ._elem._elem._12_4_;
          uVar2 = local_178.super_SelectedLiteral.interpreted.
                  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  ._elem._elem._16_4_;
          uVar3 = local_178.super_SelectedLiteral.interpreted.
                  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  ._elem._elem.init._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  .
                  super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                  ._content[0x13];
        }
        local_178.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._elem._elem.init._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        .
        super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ._content[0x13] = uVar3;
        local_178.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._elem._elem._16_4_ = uVar2;
        local_178.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._elem._elem._12_4_ = uVar1;
        local_178.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._elem._elem._8_4_ = uVar6;
        LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>::insert
                  (&(this->_index).
                    super_LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>,
                   &local_178);
      }
      else {
        local_1a0 = local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                    _elem.init.super_SelectedLiteral.litIdx;
        local_1a8 = local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                    _elem.init.super_SelectedLiteral.cl;
        local_19c = local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                    _elem.init.super_SelectedLiteral.interpreted.
                    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ._isSome;
        if (local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
            init.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._isSome != false) {
          uStack_183 = 0;
          local_198 = (ulong)(CONCAT41((int)pIVar7,unaff_R13B) & 0xffffffff03);
          iStack_190 = (uint)(uint3)local_178.super_SelectedLiteral.interpreted.
                                    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                    ._elem._elem._9_3_ << 8;
          uStack_188 = CONCAT31(local_178.super_SelectedLiteral.interpreted.
                                super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                ._elem._elem._17_3_,
                                local_178.super_SelectedLiteral.interpreted.
                                super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                ._elem._elem.init._inner.
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                .
                                super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                ._content[0xf]);
          uStack_18c = local_178.super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem._12_4_;
          cStack_184 = local_178.super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem.init._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       .
                       super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                       ._content[0x13];
        }
        local_178.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._elem._elem._8_4_ = uVar6;
        local_178.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._elem._elem._12_4_ = uVar1;
        local_178.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._elem._elem._16_4_ = uVar2;
        local_178.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._elem._elem.init._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        .
        super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ._content[0x13] = uVar3;
        LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>::remove
                  (&(this->_index).
                    super_LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>,
                   (char *)&local_1a8);
      }
      __return_storage_ptr__ = &local_148;
      uVar5 = &local_110;
      ::Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:249:17),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:80:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
      ::tryNext(__return_storage_ptr__,&local_110);
      uVar6 = SUB84(__return_storage_ptr__,0);
      if (local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._isSome == true)
      {
        if (local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
            init.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._isSome == true) {
          bVar4 = local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                  _elem._16_1_ & 3;
          in_R8 = (ulong)(uint)local_148.
                               super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem
                               ._elem._17_4_;
          uVar5 = local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                  _elem._25_8_;
          uVar6 = local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                  _elem._33_4_;
        }
        else {
          bVar4 = 0;
        }
        local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.init.
        super_SelectedLiteral.litIdx =
             local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
             init.super_SelectedLiteral.litIdx;
        local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.init.
        super_SelectedLiteral.cl =
             local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
             init.super_SelectedLiteral.cl;
        local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.init.
        super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._isSome = local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                   _elem.init.super_SelectedLiteral.interpreted.
                   super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                   ._isSome;
        if (local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
            init.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._isSome != false) {
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _37_7_ = 0;
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _17_4_ = (int)in_R8;
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _16_1_ = bVar4;
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _21_3_ = 0;
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _25_3_ = (undefined3)uVar5;
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _24_4_ = (uint)(uint3)local_1e0.
                                super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>.
                                _elem._elem._25_3_ << 8;
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _28_4_ = (undefined4)((ulong)uVar5 >> 0x18);
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _32_1_ = (undefined1)((ulong)uVar5 >> 0x38);
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _33_3_ = (undefined3)uVar6;
          local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
          _36_1_ = (undefined1)((uint)uVar6 >> 0x18);
        }
      }
      local_1e0.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._isSome =
           local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._isSome;
    } while (local_148.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._isSome !=
             false);
  }
  if (local_110._iter._inner._inn._inn._inner._func.cmp.cmpCache.
      super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110._iter._inner._inn._inn._inner._func.cmp.cmpCache.
               super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

virtual void handleClause(Clause* c, bool adding) final override
  {
    TIME_TRACE(_maintainanceStr.c_str())
    for (auto appl : T::iter(*_shared, c)) {
      if (adding) {
#if VDEBUG
        auto k = appl.key();
#endif
        _index.insert(std::move(appl));
        DEBUG_CODE(
        auto state = AbstractingUnifier::empty(AbstractionOracle(Shell::Options::UnificationWithAbstraction::OFF));
        )
        ASS_REP(find<RetrievalAlgorithms::DefaultVarBanks>(&state, k).hasNext(), Output::cat("key: ", Output::ptr(k), "\nindex: ", Output::multiline(_index)))
      } else {
        _index.remove(std::move(appl));
      }
    }
  }